

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::mock_destroyed
          (call_matcher<void_(),_std::tuple<>_> *this)

{
  sequence_handler_base *psVar1;
  
  if (this->reported == false) {
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
              ((list_elem<trompeloeil::call_matcher_base<void_()>_> *)this);
    if (((call_matcher<void_(),_std::tuple<>_> *)
         (this->super_call_matcher_base<void_()>).
         super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next != this) &&
       (psVar1 = (this->sequences)._M_t.
                 super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
                 .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl,
       psVar1->call_count < psVar1->min_calls)) {
      report_missed(this,"Pending expectation on destroyed mock object");
      return;
    }
  }
  return;
}

Assistant:

bool
    is_unfulfilled()
    const
    noexcept
    {
      return !reported && this->is_linked() && !sequences->is_satisfied();
    }